

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)121,(moira::Mode)7,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Imd im;
  Ea<(moira::Mode)7,_(moira::Size)1> dst;
  
  dst.reg = op & 7;
  dst.pc = *addr;
  dst.ext1 = dasmRead<(moira::Size)2>(this,addr);
  im.raw = 8;
  if ((op & 0xe00) != 0) {
    im.raw = op >> 9 & 7;
  }
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar1,im);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&dst);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd      ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}